

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O3

void test_list_iterate(void)

{
  long ***ppplVar1;
  long ***ppplVar2;
  undefined4 *puVar3;
  int iVar4;
  long ****pppplVar5;
  uint cond;
  LIST list;
  long ***local_40;
  long ***local_38;
  
  local_40 = (long ***)&local_40;
  local_38 = (long ***)&local_40;
  puVar3 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar3 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar3 = 1;
  *(long ****)(puVar3 + 2) = local_40;
  *(long *****)(puVar3 + 4) = &local_40;
  pppplVar5 = (long ****)(local_40 + 1);
  local_40 = (long ***)(puVar3 + 2);
  *pppplVar5 = (long ***)(puVar3 + 2);
  puVar3 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar3 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar3 = 2;
  *(long ****)(puVar3 + 2) = local_40;
  *(long *****)(puVar3 + 4) = &local_40;
  local_40[1] = (long **)(puVar3 + 2);
  local_40 = (long ***)(puVar3 + 2);
  puVar3 = (undefined4 *)malloc(0x18);
  acutest_check_((uint)(puVar3 != (undefined4 *)0x0),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x2d,"%s","d != NULL");
  *puVar3 = 3;
  pppplVar5 = (long ****)(puVar3 + 2);
  *(long ****)(puVar3 + 2) = local_40;
  *(long *****)(puVar3 + 4) = &local_40;
  local_40[1] = (long **)pppplVar5;
  local_40 = (long ***)pppplVar5;
  if ((long ****)local_38 != &local_40) {
    iVar4 = 1;
    pppplVar5 = (long ****)local_38;
    do {
      acutest_check_((uint)(iVar4 == *(int *)(pppplVar5 + -1)),
                     "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                     ,0x51,"%s","data->value == n");
      pppplVar5 = (long ****)pppplVar5[1];
      iVar4 = iVar4 + 1;
    } while (pppplVar5 != &local_40);
    if ((long ****)local_40 == &local_40) goto LAB_001041ae;
  }
  iVar4 = 3;
  pppplVar5 = (long ****)local_40;
  do {
    acutest_check_((uint)(iVar4 == *(int *)(pppplVar5 + -1)),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x57,"%s","data->value == n");
    iVar4 = iVar4 + -1;
    pppplVar5 = (long ****)*pppplVar5;
  } while (pppplVar5 != &local_40);
LAB_001041ae:
  if ((long ****)local_38 == &local_40) {
    cond = 0;
  }
  else {
    iVar4 = 3;
    do {
      ppplVar1 = (long ***)*local_38;
      ppplVar2 = (long ***)local_38[1];
      ppplVar1[1] = (long **)ppplVar2;
      *ppplVar2 = (long **)ppplVar1;
      free(local_38 + -1);
      iVar4 = iVar4 + -1;
    } while ((long ****)local_38 != &local_40);
    cond = (uint)(iVar4 == 0);
  }
  acutest_check_(cond,
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x62,"%s","n == 3");
  return;
}

Assistant:

static void
test_list_iterate(void)
{
    LIST list;
    LIST_NODE* node;
    DATA* data;
    int n;

    /* Create simple list. */
    list_init(&list);
    list_append(&list, &alloc_data(1)->list_node);
    list_append(&list, &alloc_data(2)->list_node);
    list_append(&list, &alloc_data(3)->list_node);

    /* Iterate forward. */
    for(node = list_head(&list), n = 1; node != list_end(&list); node = list_next(node), n++) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Iterate backward. */
    for(node = list_tail(&list), n = 3; node != list_end(&list); node = list_prev(node), n--) {
        data = LIST_DATA(node, DATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!list_is_empty(&list)) {
        node = list_head(&list);
        list_remove(&list, node);
        free(LIST_DATA(node, DATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}